

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O3

int decode_hex4(char *buf,uint32_t *result)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  byte bVar8;
  int iVar9;
  
  bVar2 = *buf;
  iVar3 = -0x30000;
  if (9 < (byte)(bVar2 - 0x30)) {
    bVar2 = bVar2 | 0x20;
    iVar3 = -0x57000;
    if (5 < (byte)(bVar2 + 0x9f)) {
      return -1;
    }
  }
  bVar6 = buf[1];
  iVar7 = -0x3000;
  if (9 < (byte)(bVar6 - 0x30)) {
    bVar6 = bVar6 | 0x20;
    iVar7 = -0x5700;
    if (5 < (byte)(bVar6 + 0x9f)) {
      return -1;
    }
  }
  bVar8 = buf[2];
  iVar9 = -0x300;
  if (9 < (byte)(bVar8 - 0x30)) {
    bVar8 = bVar8 | 0x20;
    iVar9 = -0x570;
    if (5 < (byte)(bVar8 + 0x9f)) {
      return -1;
    }
  }
  bVar1 = buf[3];
  iVar4 = -0x30;
  bVar5 = bVar1;
  if (9 < (byte)(bVar1 - 0x30)) {
    bVar5 = bVar1 | 0x20;
    iVar4 = -0x57;
    if (5 < (byte)((bVar1 | 0x20) + 0x9f)) {
      return -1;
    }
  }
  *result = (uint)bVar5 + iVar4 |
            (uint)bVar8 * 0x10 + iVar9 | (uint)bVar6 * 0x100 + iVar7 | (uint)bVar2 * 0x1000 + iVar3;
  return 0;
}

Assistant:

static int decode_hex4(const char *buf, uint32_t *result)
{
    uint32_t u, x;
    char c;

    u = 0;
    c = buf[0];
    if (c >= '0' && c <= '9') {
        x = (uint32_t)(c - '0');
        u = x << 12;
    } else {
        /* Lower case. */
        c |= 0x20;
        if (c >= 'a' && c <= 'f') {
            x = (uint32_t)(c - 'a' + 10);
            u |= x << 12;
        } else {
            return -1;
        }
    }
    c = buf[1];
    if (c >= '0' && c <= '9') {
        x = (uint32_t)(c - '0');
        u |= x << 8;
    } else {
        /* Lower case. */
        c |= 0x20;
        if (c >= 'a' && c <= 'f') {
            x = (uint32_t)(c - 'a' + 10);
            u |= x << 8;
        } else {
            return -1;
        }
    }
    c = buf[2];
    if (c >= '0' && c <= '9') {
        x = (uint32_t)(c - '0');
        u |= x << 4;
    } else {
        /* Lower case. */
        c |= 0x20;
        if (c >= 'a' && c <= 'f') {
            x = (uint32_t)(c - 'a' + 10);
            u |= x << 4;
        } else {
            return -1;
        }
    }
    c = buf[3];
    if (c >= '0' && c <= '9') {
        x = (uint32_t)(c - '0');
        u |= x;
    } else {
        /* Lower case. */
        c |= 0x20;
        if (c >= 'a' && c <= 'f') {
            x = (uint32_t)(c - 'a' + 10);
            u |= x;
        } else {
            return -1;
        }
    }
    *result = u;
    return 0;
}